

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O2

float direction_magnitude<dense_parameters>(vw *param_1,dense_parameters *weights)

{
  float fVar1;
  float fVar2;
  long lVar3;
  
  fVar2 = 0.0;
  for (lVar3 = 0; weights->_weight_mask * 4 + 4 != lVar3;
      lVar3 = lVar3 + (1L << ((byte)weights->_stride_shift & 0x3f)) * 4) {
    fVar1 = *(float *)((long)weights->_begin + lVar3 + 8);
    fVar2 = fVar2 + fVar1 * fVar1;
  }
  return fVar2;
}

Assistant:

iterator begin() { return iterator(_begin, _begin, stride()); }